

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O3

bool __thiscall Lexer::ReadEvalString(Lexer *this,EvalString *eval,bool path,string *err)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  byte *pbVar4;
  size_t sVar5;
  size_t sVar6;
  byte *pbVar7;
  StringPiece text;
  StringPiece text_00;
  StringPiece text_01;
  StringPiece text_02;
  StringPiece text_03;
  StringPiece text_04;
  string local_58;
  string *local_38;
  
  pbVar7 = (byte *)this->ofs_;
  local_38 = err;
LAB_0019256a:
  do {
    while( true ) {
      while (bVar2 = *pbVar7, (""[bVar2] & 0x10) != 0) {
        sVar6 = 0;
        do {
          lVar3 = sVar6 + 1;
          sVar6 = sVar6 + 1;
        } while ((""[pbVar7[lVar3]] & 0x10) != 0);
        text.len_ = sVar6;
        text.str_ = (char *)pbVar7;
        EvalString::AddText(eval,text);
        pbVar7 = pbVar7 + sVar6;
      }
      if (0xd < bVar2) break;
      if (bVar2 == 0) {
        this->last_token_ = (char *)pbVar7;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"unexpected EOF","");
        Error(this,&local_58,local_38);
        goto LAB_00192803;
      }
      if (10 < bVar2) {
        if (pbVar7[1] == 10) {
          this->last_token_ = (char *)pbVar7;
          this->ofs_ = (char *)(pbVar7 + (ulong)!path * 2);
          if (!path) {
            return true;
          }
          goto LAB_0019272a;
        }
        this->last_token_ = (char *)pbVar7;
        DescribeLastError_abi_cxx11_(&local_58,this);
        Error(this,&local_58,local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p == &local_58.field_2) {
          return false;
        }
        goto LAB_0019280c;
      }
LAB_001925ef:
      if (path) {
        this->last_token_ = (char *)pbVar7;
        this->ofs_ = (char *)pbVar7;
LAB_0019272a:
        EatWhitespace(this);
        return true;
      }
      if (bVar2 == 10) {
        this->last_token_ = (char *)pbVar7;
        this->ofs_ = (char *)(pbVar7 + 1);
        return true;
      }
      text_00.len_ = 1;
      text_00.str_ = (char *)pbVar7;
      EvalString::AddText(eval,text_00);
      pbVar7 = pbVar7 + 1;
    }
    if (3 < (byte)(bVar2 - 0x21)) goto LAB_001925ef;
    pbVar4 = pbVar7 + 1;
    bVar2 = pbVar7[1];
    if ((""[bVar2] & 0x40) != 0) {
      sVar6 = 0;
      pbVar7 = pbVar4;
      do {
        pbVar1 = pbVar7 + 1;
        pbVar7 = pbVar7 + 1;
        sVar6 = sVar6 + 1;
      } while ((""[*pbVar1] & 0x40) != 0);
LAB_00192633:
      text_01.len_ = sVar6;
      text_01.str_ = (char *)pbVar4;
      EvalString::AddSpecial(eval,text_01);
      goto LAB_0019256a;
    }
    if (bVar2 < 0x21) {
      if (bVar2 < 0xd) {
        if (bVar2 != 10) goto LAB_001927d0;
        do {
          pbVar7 = pbVar4 + 1;
          pbVar1 = pbVar4 + 1;
          pbVar4 = pbVar7;
        } while (*pbVar1 == 0x20);
      }
      else if (bVar2 == 0xd) {
        if (pbVar7[2] != 10) goto LAB_001927d0;
        pbVar4 = pbVar7 + 2;
        do {
          pbVar7 = pbVar4 + 1;
          pbVar1 = pbVar4 + 1;
          pbVar4 = pbVar7;
        } while (*pbVar1 == 0x20);
      }
      else {
        if (bVar2 != 0x20) goto LAB_001927d0;
        pbVar7 = pbVar7 + 2;
        text_03.len_ = 1;
        text_03.str_ = " ";
        EvalString::AddText(eval,text_03);
      }
    }
    else if (bVar2 < 0x30) {
      if (bVar2 != 0x24) goto LAB_001927d0;
      pbVar7 = pbVar7 + 2;
      text_02.len_ = 1;
      text_02.str_ = "$";
      EvalString::AddText(eval,text_02);
    }
    else {
      if (0x3a < bVar2) {
        if (((byte)(bVar2 + 0x9f) < 0x1b) && ((char)""[pbVar7[2]] < '\0')) {
          pbVar4 = pbVar7 + 2;
          sVar6 = 0;
          do {
            sVar5 = sVar6;
            sVar6 = sVar5 + 1;
          } while ((char)""[pbVar7[sVar5 + 3]] < '\0');
          if (pbVar7[sVar5 + 3] == 0x7d) {
            pbVar7 = pbVar7 + sVar5 + 4;
            goto LAB_00192633;
          }
        }
LAB_001927d0:
        this->last_token_ = (char *)pbVar7;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"bad $-escape (literal $ must be written as $$)","");
        Error(this,&local_58,local_38);
LAB_00192803:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p == &local_58.field_2) {
          return false;
        }
LAB_0019280c:
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        return false;
      }
      pbVar7 = pbVar7 + 2;
      text_04.len_ = 1;
      text_04.str_ = ":";
      EvalString::AddText(eval,text_04);
    }
  } while( true );
}

Assistant:

bool Lexer::ReadEvalString(EvalString* eval, bool path, string* err) {
  const char* p = ofs_;
  const char* q;
  const char* start;
  for (;;) {
    start = p;
    
{
	unsigned char yych;
	static const unsigned char yybm[] = {
		  0,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,   0,  16,  16,   0,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 32,  16,  16,  16,   0,  16,  16,  16, 
		 16,  16,  16,  16,  16, 208, 144,  16, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208,   0,  16,  16,  16,  16,  16, 
		 16, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208,  16,  16,  16,  16, 208, 
		 16, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208,  16,   0,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
	};
	yych = *p;
	if (yybm[0+yych] & 16) {
		goto yy100;
	}
	if (yych <= '\r') {
		if (yych <= 0x00) goto yy98;
		if (yych <= '\n') goto yy103;
		goto yy105;
	} else {
		if (yych <= ' ') goto yy103;
		if (yych <= '$') goto yy107;
		goto yy103;
	}
yy98:
	++p;
	{
      last_token_ = start;
      return Error("unexpected EOF", err);
    }
yy100:
	yych = *++p;
	if (yybm[0+yych] & 16) {
		goto yy100;
	}
	{
      eval->AddText(StringPiece(start, p - start));
      continue;
    }
yy103:
	++p;
	{
      if (path) {
        p = start;
        break;
      } else {
        if (*start == '\n')
          break;
        eval->AddText(StringPiece(start, 1));
        continue;
      }
    }
yy105:
	yych = *++p;
	if (yych == '\n') goto yy108;
	{
      last_token_ = start;
      return Error(DescribeLastError(), err);
    }
yy107:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy120;
	}
	if (yych <= ' ') {
		if (yych <= '\f') {
			if (yych == '\n') goto yy112;
			goto yy110;
		} else {
			if (yych <= '\r') goto yy115;
			if (yych <= 0x1F) goto yy110;
			goto yy116;
		}
	} else {
		if (yych <= '/') {
			if (yych == '$') goto yy118;
			goto yy110;
		} else {
			if (yych <= ':') goto yy123;
			if (yych <= '`') goto yy110;
			if (yych <= '{') goto yy125;
			goto yy110;
		}
	}
yy108:
	++p;
	{
      if (path)
        p = start;
      break;
    }
yy110:
	++p;
yy111:
	{
      last_token_ = start;
      return Error("bad $-escape (literal $ must be written as $$)", err);
    }
yy112:
	yych = *++p;
	if (yybm[0+yych] & 32) {
		goto yy112;
	}
	{
      continue;
    }
yy115:
	yych = *++p;
	if (yych == '\n') goto yy126;
	goto yy111;
yy116:
	++p;
	{
      eval->AddText(StringPiece(" ", 1));
      continue;
    }
yy118:
	++p;
	{
      eval->AddText(StringPiece("$", 1));
      continue;
    }
yy120:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy120;
	}
	{
      eval->AddSpecial(StringPiece(start + 1, p - start - 1));
      continue;
    }
yy123:
	++p;
	{
      eval->AddText(StringPiece(":", 1));
      continue;
    }
yy125:
	yych = *(q = ++p);
	if (yybm[0+yych] & 128) {
		goto yy129;
	}
	goto yy111;
yy126:
	yych = *++p;
	if (yych == ' ') goto yy126;
	{
      continue;
    }
yy129:
	yych = *++p;
	if (yybm[0+yych] & 128) {
		goto yy129;
	}
	if (yych == '}') goto yy132;
	p = q;
	goto yy111;
yy132:
	++p;
	{
      eval->AddSpecial(StringPiece(start + 2, p - start - 3));
      continue;
    }
}

  }
  last_token_ = start;
  ofs_ = p;
  if (path)
    EatWhitespace();
  // Non-path strings end in newlines, so there's no whitespace to eat.
  return true;
}